

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O1

void __thiscall
BamTools::ConvertTool::ConvertToolPrivate::PrintBed(ConvertToolPrivate *this,BamAlignment *a)

{
  pointer pRVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  char local_1e [6];
  
  uVar6 = (ulong)a->RefID;
  pRVar1 = (this->m_references).
           super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = ((long)(this->m_references).
                 super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pRVar1 >> 3) * -0x3333333333333333;
  if (uVar6 <= uVar5 && uVar5 - uVar6 != 0) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (&this->m_out,pRVar1[uVar6].RefName._M_dataplus._M_p,
                        pRVar1[uVar6].RefName._M_string_length);
    local_1e[0] = '\t';
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_1e,1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,a->Position);
    local_1e[1] = 9;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_1e + 1,1);
    iVar3 = BamAlignment::GetEndPosition(a,false,false);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    local_1e[2] = 9;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_1e + 2,1);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(a->Name)._M_dataplus._M_p,(a->Name)._M_string_length);
    local_1e[3] = 9;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_1e + 3,1);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    local_1e[4] = 9;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_1e + 4,1);
    bVar2 = BamAlignment::IsReverseStrand(a);
    local_1e[5] = bVar2 * '\x02' + '+';
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_1e + 5,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void ConvertTool::ConvertToolPrivate::PrintBed(const BamAlignment& a)
{

    // tab-delimited, 0-based half-open
    // (e.g. a 50-base read aligned to pos 10 could have BED coordinates (10, 60) instead of BAM coordinates (10, 59) )
    // <chromName> <chromStart> <chromEnd> <readName> <score> <strand>

    m_out << m_references.at(a.RefID).RefName << '\t' << a.Position << '\t' << a.GetEndPosition()
          << '\t' << a.Name << '\t' << a.MapQuality << '\t' << (a.IsReverseStrand() ? '-' : '+')
          << std::endl;
}